

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_data_edge.h
# Opt level: O2

string_view absl::lts_20240722::cord_internal::EdgeData(CordRep *edge)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  CordRepSubstring *pCVar4;
  CordRepFlat *pCVar5;
  CordRepExternal *pCVar6;
  uint8_t *puVar7;
  size_t sVar8;
  string_view sVar9;
  
  bVar2 = IsDataEdge(edge);
  if (bVar2) {
    sVar1 = edge->length;
    bVar3 = edge->tag;
    if (bVar3 == 1) {
      pCVar4 = CordRep::substring(edge);
      sVar8 = pCVar4->start;
      pCVar4 = CordRep::substring(edge);
      edge = pCVar4->child;
      bVar3 = edge->tag;
    }
    else {
      sVar8 = 0;
    }
    if (bVar3 < 6) {
      pCVar6 = CordRep::external(edge);
      puVar7 = (uint8_t *)pCVar6->base;
    }
    else {
      pCVar5 = CordRep::flat(edge);
      puVar7 = (pCVar5->super_CordRep).storage;
    }
    sVar9._M_str = puVar7 + sVar8;
    sVar9._M_len = sVar1;
    return sVar9;
  }
  __assert_fail("IsDataEdge(edge)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
}

Assistant:

inline absl::string_view EdgeData(const CordRep* edge) {
  assert(IsDataEdge(edge));

  size_t offset = 0;
  const size_t length = edge->length;
  if (edge->IsSubstring()) {
    offset = edge->substring()->start;
    edge = edge->substring()->child;
  }
  return edge->tag >= FLAT
             ? absl::string_view{edge->flat()->Data() + offset, length}
             : absl::string_view{edge->external()->base + offset, length};
}